

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

void __thiscall Debugger::DoAction(Debugger *this,DebugAction action)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<HookState> local_78;
  shared_ptr<HookState> local_68;
  shared_ptr<HookState> local_58;
  shared_ptr<HookState> local_48;
  shared_ptr<HookState> local_38;
  shared_ptr<HookState> local_28;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->hookStateMtx);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  switch(action) {
  case Break:
    local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->manager->stateBreak).
           super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_HookState;
    local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->manager->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SetHookState(this,&local_28);
    this_00._M_pi =
         local_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case Continue:
    local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->manager->stateContinue).
           super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_HookState;
    local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->manager->stateContinue).
         super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SetHookState(this,&local_38);
    this_00._M_pi =
         local_38.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case StepOver:
    local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (this->manager->stateStepOver).
         super___shared_ptr<HookStateStepOver,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->manager->stateStepOver).
         super___shared_ptr<HookStateStepOver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SetHookState(this,&local_48);
    this_00._M_pi =
         local_48.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case StepIn:
    local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (this->manager->stateStepIn).
         super___shared_ptr<HookStateStepIn,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->manager->stateStepIn).
         super___shared_ptr<HookStateStepIn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SetHookState(this,&local_58);
    this_00._M_pi =
         local_58.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case StepOut:
    local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (this->manager->stateStepOut).
         super___shared_ptr<HookStateStepOut,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->manager->stateStepOut).
         super___shared_ptr<HookStateStepOut,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SetHookState(this,&local_78);
    this_00._M_pi =
         local_78.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  case Stop:
    local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->manager->stateStop).super___shared_ptr<HookStateStop,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->super_HookState;
    local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->manager->stateStop).super___shared_ptr<HookStateStop,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SetHookState(this,&local_68);
    this_00._M_pi =
         local_68.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    break;
  default:
    goto switchD_00146cd8_default;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
switchD_00146cd8_default:
  pthread_mutex_unlock((pthread_mutex_t *)&this->hookStateMtx);
  return;
}

Assistant:

void Debugger::DoAction(DebugAction action) {
	// 锁加到这里
	std::lock_guard<std::mutex> lock(hookStateMtx);
	switch (action) {
		case DebugAction::Break:
			SetHookState(manager->stateBreak);
			break;
		case DebugAction::Continue:
			SetHookState(manager->stateContinue);
			break;
		case DebugAction::StepOver:
			SetHookState(manager->stateStepOver);
			break;
		case DebugAction::StepIn:
			SetHookState(manager->stateStepIn);
			break;
		case DebugAction::Stop:
			SetHookState(manager->stateStop);
			break;
		case DebugAction::StepOut:
			SetHookState(manager->stateStepOut);
			break;
		default:
			break;
	}
}